

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O0

void __thiscall
flow::BinaryInstr<(flow::BinaryOperator)20,_(flow::LiteralType)3>::BinaryInstr
          (BinaryInstr<(flow::BinaryOperator)20,_(flow::LiteralType)3> *this,Value *lhs,Value *rhs,
          string *name)

{
  initializer_list<flow::Value_*> __l;
  allocator<flow::Value_*> local_61;
  Value *local_60;
  Value *local_58;
  iterator local_50;
  size_type local_48;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_40;
  string *local_28;
  string *name_local;
  Value *rhs_local;
  Value *lhs_local;
  BinaryInstr<(flow::BinaryOperator)20,_(flow::LiteralType)3> *this_local;
  
  local_50 = &local_60;
  local_48 = 2;
  local_60 = lhs;
  local_58 = rhs;
  local_28 = name;
  name_local = (string *)rhs;
  rhs_local = lhs;
  lhs_local = (Value *)this;
  std::allocator<flow::Value_*>::allocator(&local_61);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_40,__l,&local_61);
  Instr::Instr(&this->super_Instr,String,&local_40,local_28);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector(&local_40);
  std::allocator<flow::Value_*>::~allocator(&local_61);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__BinaryInstr_002d2c70;
  this->operator_ = SAdd;
  return;
}

Assistant:

BinaryInstr(Value* lhs, Value* rhs, const std::string& name)
      : Instr(ResultType, {lhs, rhs}, name), operator_(Operator) {}